

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::correlatedoutputgul(gulcalc *this,gulitemSampleslevel *gg)

{
  uchar *puVar1;
  gulSampleslevelRec r;
  gulSampleslevelRec r_1;
  gulitemSampleslevel *gg_local;
  gulcalc *this_local;
  
  if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    if (15999 < this->correlatedbufoffset_) {
      (*this->correlatedWriter_)(this->corrbuf_,1,this->correlatedbufoffset_);
      this->correlatedbufoffset_ = 0;
    }
    if ((gg->event_id != lastcorrelatedheader.event_id) ||
       (gg->item_id != lastcorrelatedheader.item_id)) {
      if ((this->isFirstCorrelatedEvent_ & 1U) == 0) {
        puVar1 = this->corrbuf_ + this->correlatedbufoffset_;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        this->correlatedbufoffset_ = this->correlatedbufoffset_ + 8;
      }
      else {
        this->isFirstCorrelatedEvent_ = false;
      }
      lastcorrelatedheader.event_id = gg->event_id;
      lastcorrelatedheader.item_id = gg->item_id;
      *(undefined8 *)(this->corrbuf_ + this->correlatedbufoffset_) = *(undefined8 *)gg;
      this->correlatedbufoffset_ = this->correlatedbufoffset_ + 8;
    }
    *(undefined8 *)(this->corrbuf_ + this->correlatedbufoffset_) = *(undefined8 *)&gg->sidx;
    this->correlatedbufoffset_ = this->correlatedbufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::correlatedoutputgul(gulitemSampleslevel &gg)
{
	if (correlatedWriter_ == 0) return;
	if (correlatedbufoffset_ >= bufsize) {
		correlatedWriter_(corrbuf_, sizeof(unsigned char), correlatedbufoffset_);
		correlatedbufoffset_ = 0;
	}

	if(gg.event_id != lastcorrelatedheader.event_id || gg.item_id != lastcorrelatedheader.item_id) {
		if (isFirstCorrelatedEvent_ == false) {
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(corrbuf_ + correlatedbufoffset_, &r, sizeof(gulSampleslevelRec));
			correlatedbufoffset_ += sizeof(gulSampleslevelRec);
		}
		else {
			isFirstCorrelatedEvent_ = false;
		}
		lastcorrelatedheader.event_id = gg.event_id;
		lastcorrelatedheader.item_id = gg.item_id;
		memcpy(corrbuf_ + correlatedbufoffset_, &lastcorrelatedheader, sizeof(lastcorrelatedheader));
		correlatedbufoffset_ += sizeof(lastcorrelatedheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;
	memcpy(corrbuf_ + correlatedbufoffset_, &r, sizeof(gulSampleslevelRec));
	correlatedbufoffset_ += sizeof(gulSampleslevelRec);

}